

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O2

unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> __thiscall
spvtools::
MakeUnique<spvtools::opt::Function,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
          (spvtools *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *args)

{
  Function *this_00;
  pointer *__ptr;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_28;
  
  this_00 = (Function *)operator_new(0xd0);
  local_28._M_head_impl =
       (args->_M_t).
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  (args->_M_t).
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  opt::Function::Function
            (this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&local_28);
  *(Function **)this = this_00;
  if (local_28._M_head_impl != (Instruction *)0x0) {
    (*((local_28._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return (__uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}